

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.hpp
# Opt level: O2

double TasGrid::MultiIndexManipulations::getIndexWeight<double,(TasGrid::TypeDepth)2>
                 (int *index,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *cache)

{
  long lVar1;
  pointer pvVar2;
  size_t j;
  long lVar3;
  double dVar4;
  
  pvVar2 = (cache->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(cache->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
  dVar4 = 0.0;
  for (lVar3 = 0; lVar1 / 0x18 != lVar3; lVar3 = lVar3 + 1) {
    dVar4 = dVar4 + *(double *)
                     (*(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data + (long)index[lVar3] * 8);
    pvVar2 = pvVar2 + 1;
  }
  return dVar4;
}

Assistant:

inline CacheType getIndexWeight(int const index[], std::vector<std::vector<CacheType>> const &cache){
    CacheType w = (contour == type_hyperbolic) ? 1 : 0;
    for(size_t j=0; j<cache.size(); j++)
        if (contour == type_hyperbolic)
            w *= cache[j][index[j]];
        else
            w += cache[j][index[j]];
    return w;
}